

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

int isNearBorderOf(Point32 *coord32,TerritoryBoundary *b)

{
  int iVar1;
  TerritoryBoundary *pTVar2;
  byte local_31;
  undefined1 local_30 [8];
  TerritoryBoundary tmp;
  int xdiv8;
  TerritoryBoundary *b_local;
  Point32 *coord32_local;
  
  unique0x1000009c = b;
  iVar1 = xDivider4(b->miny,b->maxy);
  tmp.maxy = iVar1 / 4;
  pTVar2 = getExtendedBoundaries
                     ((TerritoryBoundary *)local_30,stack0xffffffffffffffe8,0x3c,tmp.maxy);
  iVar1 = fitsInsideBoundaries(coord32,pTVar2);
  local_31 = 0;
  if (iVar1 != 0) {
    pTVar2 = getExtendedBoundaries
                       ((TerritoryBoundary *)local_30,stack0xffffffffffffffe8,-0x3c,-tmp.maxy);
    iVar1 = fitsInsideBoundaries(coord32,pTVar2);
    local_31 = iVar1 != 0 ^ 0xff;
  }
  return (int)(local_31 & 1);
}

Assistant:

static int isNearBorderOf(const Point32 *coord32, const TerritoryBoundary *b) {
    int xdiv8 = xDivider4(b->miny, b->maxy) / 4; // should be /8 but there's some extra margin
    TerritoryBoundary tmp;
    ASSERT(coord32);
    ASSERT(b);
    return (fitsInsideBoundaries(coord32, getExtendedBoundaries(&tmp, b, +60, +xdiv8)) &&
            (!fitsInsideBoundaries(coord32, getExtendedBoundaries(&tmp, b, -60, -xdiv8))));
}